

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O3

lzma_ret lzma_filters_update(lzma_stream *strm,lzma_filter *filters)

{
  lzma_vli *plVar1;
  void *pvVar2;
  long lVar3;
  lzma_ret lVar4;
  uint64_t uVar5;
  long lVar6;
  long lVar7;
  lzma_filter *plVar8;
  lzma_filter reversed_filters [5];
  lzma_filter local_68;
  lzma_vli local_58 [9];
  
  if ((strm->internal->next).update ==
      (_func_lzma_ret_void_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr *)0x0) {
    lVar4 = LZMA_PROG_ERROR;
  }
  else {
    uVar5 = lzma_raw_coder_memusage(encoder_find,filters);
    if (uVar5 == 0xffffffffffffffff) {
      lVar4 = LZMA_OPTIONS_ERROR;
    }
    else {
      lVar6 = 0;
      lVar3 = 0;
      do {
        lVar7 = lVar3;
        lVar6 = lVar6 + 1;
        lVar3 = lVar7 + 0x10;
      } while (*(long *)((long)&filters[1].id + lVar7) != -1);
      if (lVar6 != 0) {
        plVar8 = filters;
        plVar1 = (lzma_vli *)((long)local_58 + lVar7);
        do {
          pvVar2 = plVar8->options;
          plVar1[-2] = plVar8->id;
          plVar1[-1] = (lzma_vli)pvVar2;
          plVar8 = plVar8 + 1;
          lVar6 = lVar6 + -1;
          plVar1 = plVar1 + -2;
        } while (lVar6 != 0);
      }
      *(undefined8 *)((long)local_58 + lVar7) = 0xffffffffffffffff;
      lVar4 = (*(strm->internal->next).update)
                        ((strm->internal->next).coder,strm->allocator,filters,&local_68);
    }
  }
  return lVar4;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_filters_update(lzma_stream *strm, const lzma_filter *filters)
{
	if (strm->internal->next.update == NULL)
		return LZMA_PROG_ERROR;

	// Validate the filter chain.
	if (lzma_raw_encoder_memusage(filters) == UINT64_MAX)
		return LZMA_OPTIONS_ERROR;

	// The actual filter chain in the encoder is reversed. Some things
	// still want the normal order chain, so we provide both.
	size_t count = 1;
	while (filters[count].id != LZMA_VLI_UNKNOWN)
		++count;

	lzma_filter reversed_filters[LZMA_FILTERS_MAX + 1];
	for (size_t i = 0; i < count; ++i)
		reversed_filters[count - i - 1] = filters[i];

	reversed_filters[count].id = LZMA_VLI_UNKNOWN;

	return strm->internal->next.update(strm->internal->next.coder,
			strm->allocator, filters, reversed_filters);
}